

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase90::run(TestCase90 *this)

{
  bool bVar1;
  int local_128;
  bool local_121;
  int local_120;
  DebugExpression<int> DStack_11c;
  bool _kj_shouldLog_2;
  undefined1 local_118 [8];
  DebugComparison<int,_int_&> _kjCondition_2;
  int local_e8;
  DebugExpression<int> DStack_e4;
  bool _kj_shouldLog_1;
  undefined1 local_e0 [8];
  DebugComparison<int,_int_&> _kjCondition_1;
  TestObject *local_b0;
  bool local_a1;
  TestObject *pTStack_a0;
  bool _kj_shouldLog;
  TestObject *local_98;
  TestObject *local_90;
  undefined1 local_88 [8];
  DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
  _kjCondition;
  Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> obj2;
  undefined1 local_40 [8];
  Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> obj1;
  Arena arena;
  TestCase90 *this_local;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  Arena::Arena((Arena *)&obj1.ptr,0x400);
  Arena::allocateOwn<kj::(anonymous_namespace)::TestObject>((Arena *)local_40);
  Arena::allocateOwn<kj::(anonymous_namespace)::TestObject>((Arena *)&_kjCondition.result);
  local_98 = Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t>::get
                       ((Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> *)local_40);
  local_90 = (TestObject *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_98);
  pTStack_a0 = Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t>::get
                         ((Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> *)
                          &_kjCondition.result);
  kj::_::DebugExpression<kj::(anonymous_namespace)::TestObject*>::operator<
            ((DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
              *)local_88,(DebugExpression<kj::(anonymous_namespace)::TestObject*> *)&local_90,
             &stack0xffffffffffffff60);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
  if (!bVar1) {
    local_a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_a1 != false) {
      local_b0 = Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t>::get
                           ((Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> *)local_40);
      _kjCondition_1._32_8_ =
           Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t>::get
                     ((Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> *)
                      &_kjCondition.result);
      kj::_::Debug::
      log<char_const(&)[45],kj::_::DebugComparison<kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>&,kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                 ,99,ERROR,
                 "\"failed: expected \" \"(obj1.get()) < (obj2.get())\", _kjCondition, obj1.get(), obj2.get()"
                 ,(char (*) [45])"failed: expected (obj1.get()) < (obj2.get())",
                 (DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
                  *)local_88,&local_b0,(TestObject **)&_kjCondition_1.result);
      local_a1 = false;
    }
  }
  local_e8 = 2;
  DStack_e4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_e8);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_e0,&stack0xffffffffffffff1c,
             &(anonymous_namespace)::TestObject::count);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
  if (!bVar1) {
    _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._39_1_ != '\0') {
      _kjCondition_2.result = true;
      _kjCondition_2._33_3_ = 0;
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x65,ERROR,
                 "\"failed: expected \" \"(2) == (TestObject::count)\", _kjCondition, 2, TestObject::count"
                 ,(char (*) [44])"failed: expected (2) == (TestObject::count)",
                 (DebugComparison<int,_int_&> *)local_e0,(int *)&_kjCondition_2.result,
                 &(anonymous_namespace)::TestObject::count);
      _kjCondition_2._39_1_ = 0;
    }
  }
  Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> *)&_kjCondition.result);
  Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> *)local_40);
  local_120 = 0;
  DStack_11c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_120);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_118,&stack0xfffffffffffffee4,
             &(anonymous_namespace)::TestObject::count);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_118);
  if (!bVar1) {
    local_121 = kj::_::Debug::shouldLog(ERROR);
    while (local_121 != false) {
      local_128 = 0;
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0x68,ERROR,
                 "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
                 ,(char (*) [44])"failed: expected (0) == (TestObject::count)",
                 (DebugComparison<int,_int_&> *)local_118,&local_128,
                 &(anonymous_namespace)::TestObject::count);
      local_121 = false;
    }
  }
  Arena::~Arena((Arena *)&obj1.ptr);
  return;
}

Assistant:

TEST(Arena, OwnObject) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Arena arena;

  {
    Own<TestObject> obj1 = arena.allocateOwn<TestObject>();
    Own<TestObject> obj2 = arena.allocateOwn<TestObject>();
    EXPECT_LT(obj1.get(), obj2.get());

    EXPECT_EQ(2, TestObject::count);
  }

  EXPECT_EQ(0, TestObject::count);
}